

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

void duckdb::ReadDataFromPrimitiveSegment<short>
               (ListSegmentFunctions *param_1,ListSegment *segment,Vector *result,idx_t *total_count
               )

{
  ulong *puVar1;
  ulong uVar2;
  idx_t iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  ulong uVar10;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  if (segment->count != 0) {
    uVar10 = 0;
    do {
      if (*(char *)((long)&segment[1].count + uVar10) == '\x01') {
        iVar3 = *total_count;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_48,&local_38);
          p_Var8 = p_Stack_40;
          peVar7 = local_48;
          local_48 = (element_type *)0x0;
          p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar7;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var8;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar6 = (byte)(iVar3 + uVar10) & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (iVar3 + uVar10 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < segment->count);
  }
  if (segment->count != 0) {
    iVar3 = *total_count;
    puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar5 = result->data;
    uVar10 = 0;
    do {
      if ((puVar4 == (unsigned_long *)0x0) ||
         (uVar2 = iVar3 + uVar10, (puVar4[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0)) {
        *(undefined2 *)(pdVar5 + uVar10 * 2 + iVar3 * 2) =
             *(undefined2 *)((long)&segment[1].count + uVar10 * 2 + (ulong)segment->capacity);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < segment->count);
  }
  return;
}

Assistant:

static void ReadDataFromPrimitiveSegment(const ListSegmentFunctions &, const ListSegment *segment, Vector &result,
                                         idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto aggr_vector_data = FlatVector::GetData<T>(result);

	// load values
	for (idx_t i = 0; i < segment->count; i++) {
		if (aggr_vector_validity.RowIsValid(total_count + i)) {
			auto data = GetPrimitiveData<T>(segment);
			aggr_vector_data[total_count + i] = Load<T>(const_data_ptr_cast(data + i));
		}
	}
}